

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_File * PHYSFS_openRead(char *_fname)

{
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  char *pcVar4;
  int iVar5;
  char *in_RAX;
  FileHandle *pFVar6;
  size_t sVar7;
  ulong *puVar8;
  PHYSFS_Io *pPVar9;
  char **ppcVar10;
  PHYSFS_ErrorCode PVar11;
  DirHandle *h;
  char *dst;
  bool bVar12;
  char *local_38;
  char *arcfname;
  
  ppcVar10 = &local_38;
  if (_fname == (char *)0x0) {
    PVar11 = PHYSFS_ERR_INVALID_ARGUMENT;
LAB_001098e4:
    PHYSFS_setErrorCode(PVar11);
    return (PHYSFS_File *)0x0;
  }
  if ((magicStream != (FileHandle *)0x0) && (magicStream->forReading != '\0')) {
    pFVar6 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
    if (pFVar6 != (FileHandle *)0x0) {
      pFVar6->io = (PHYSFS_Io *)0x0;
      *(undefined8 *)&pFVar6->forReading = 0;
      pFVar6->dirHandle = (DirHandle *)0x0;
      pFVar6->buffer = (PHYSFS_uint8 *)0x0;
      pFVar6->bufpos = 0;
      pFVar6->next = (__PHYSFS_FILEHANDLE__ *)0x0;
      pFVar6->bufsize = 0;
      pFVar6->buffill = 0;
      pFVar6->forReading = '\x01';
      pFVar6->dirHandle = (DirHandle *)0x0;
      pFVar6->next = openReadList;
      openReadList = pFVar6;
      return (PHYSFS_File *)pFVar6;
    }
    PVar11 = PHYSFS_ERR_OUT_OF_MEMORY;
    goto LAB_001098e4;
  }
  local_38 = in_RAX;
  __PHYSFS_platformGrabMutex(stateLock);
  if (searchPath == (DirHandle *)0x0) {
    PVar11 = PHYSFS_ERR_NOT_FOUND;
LAB_00109a2d:
    *(undefined8 *)((long)ppcVar10 + -8) = 0x109a32;
    PHYSFS_setErrorCode(PVar11);
    *(undefined8 *)((long)ppcVar10 + -8) = 0x109a3e;
    __PHYSFS_platformReleaseMutex(stateLock);
    return (PHYSFS_File *)0x0;
  }
  sVar7 = strlen(_fname);
  if (sVar7 + longest_root + 1 < 0x100) {
    puVar8 = (ulong *)((long)&local_38 - (longest_root + sVar7 + 0x18 & 0xfffffffffffffff0));
    ppcVar10 = (char **)puVar8;
  }
  else {
    puVar8 = (ulong *)0x0;
    ppcVar10 = &local_38;
  }
  bVar12 = puVar8 == (ulong *)0x0;
  if (bVar12) {
    ppcVar10[-1] = (char *)0x109910;
    puVar8 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(longest_root + sVar7 + 9);
  }
  if (puVar8 == (ulong *)0x0) {
    puVar8 = (ulong *)0x0;
  }
  else {
    *puVar8 = (ulong)bVar12;
    puVar8 = puVar8 + 1;
  }
  if (puVar8 == (ulong *)0x0) {
    PVar11 = PHYSFS_ERR_OUT_OF_MEMORY;
    goto LAB_00109a2d;
  }
  dst = (char *)(longest_root + (long)puVar8);
  ppcVar10[-1] = (char *)0x10994b;
  iVar5 = sanitizePlatformIndependentPath(_fname,dst);
  if (iVar5 != 0) {
    pPVar9 = (PHYSFS_Io *)0x0;
    h = searchPath;
    if (searchPath != (DirHandle *)0x0) {
      do {
        local_38 = dst;
        ppcVar10[-1] = (char *)0x109977;
        iVar5 = verifyPath(h,&local_38,0);
        pcVar4 = local_38;
        if (iVar5 == 0) {
          bVar12 = true;
        }
        else {
          pvVar1 = h->opaque;
          p_Var2 = h->funcs->openRead;
          ppcVar10[-1] = (char *)0x109989;
          pPVar9 = (*p_Var2)(pvVar1,pcVar4);
          bVar12 = pPVar9 == (PHYSFS_Io *)0x0;
        }
      } while ((bVar12) && (h = h->next, h != (DirHandle *)0x0));
    }
    if (pPVar9 != (PHYSFS_Io *)0x0) {
      ppcVar10[-1] = (char *)0x1099b3;
      pFVar6 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
      if (pFVar6 == (FileHandle *)0x0) {
        p_Var3 = pPVar9->destroy;
        ppcVar10[-1] = (char *)0x1099c3;
        (*p_Var3)(pPVar9);
        ppcVar10[-1] = (char *)0x1099cd;
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      }
      pFVar6->io = (PHYSFS_Io *)0x0;
      *(undefined8 *)&pFVar6->forReading = 0;
      pFVar6->dirHandle = (DirHandle *)0x0;
      pFVar6->buffer = (PHYSFS_uint8 *)0x0;
      pFVar6->bufpos = 0;
      pFVar6->next = (__PHYSFS_FILEHANDLE__ *)0x0;
      pFVar6->bufsize = 0;
      pFVar6->buffill = 0;
      pFVar6->io = pPVar9;
      pFVar6->forReading = '\x01';
      pFVar6->dirHandle = h;
      pFVar6->next = openReadList;
      openReadList = pFVar6;
      goto LAB_00109a06;
    }
  }
  pFVar6 = (FileHandle *)0x0;
LAB_00109a06:
  ppcVar10[-1] = (char *)0x109a12;
  __PHYSFS_platformReleaseMutex(stateLock);
  if (puVar8[-1] != 0) {
    ppcVar10[-1] = (char *)0x109a26;
    (*__PHYSFS_AllocatorHooks.Free)(puVar8 + -1);
    return (PHYSFS_File *)pFVar6;
  }
  return (PHYSFS_File *)pFVar6;
}

Assistant:

PHYSFS_File *PHYSFS_openRead(const char *_fname)
{
    FileHandle *fh = NULL;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    if (magicStream && magicStream->forReading)
    {
        /* magic stream replay: file opens are NOPs, so
           we'll create a dummy file handle. */
        fh = (FileHandle *)allocator.Malloc(sizeof(FileHandle));
        if (fh == NULL)
        {
            PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            return NULL;
        } /* if */

        memset(fh, '\0', sizeof(FileHandle));
        fh->io = 0;
        fh->forReading = 1;
        fh->dirHandle = 0;
        fh->next = openReadList;
        openReadList = fh;

        return ((PHYSFS_File *)fh);
    } /* if */

    __PHYSFS_platformGrabMutex(stateLock);

    BAIL_IF_MUTEX(!searchPath, PHYSFS_ERR_NOT_FOUND, stateLock, 0);

    len = strlen(_fname) + longest_root + 1;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *i;

        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (verifyPath(i, &arcfname, 0))
            {
                io = i->funcs->openRead(i->opaque, arcfname);
                if (io)
                    break;
            } /* if */
        } /* for */

        if (io)
        {
            fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
            if (fh == NULL)
            {
                io->destroy(io);
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            } /* if */

            memset(fh, '\0', sizeof (FileHandle));
            fh->io = io;
            fh->forReading = 1;
            fh->dirHandle = i;
            fh->next = openReadList;
            openReadList = fh;
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return ((PHYSFS_File *) fh);
}